

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * __thiscall
Lowerer::GenerateGetImmutableOrScriptUnreferencedString
          (Lowerer *this,RegOpnd *strOpnd,Instr *insertBeforeInstr,JnHelperMethod helperMethod,
          bool loweringCloneStr,bool reloadDst)

{
  Func *pFVar1;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  LabelInstr *target;
  LabelInstr *labelTarget;
  AddrOpnd *pAVar7;
  IndirOpnd *compareSrc1;
  undefined4 extraout_var;
  Instr *instr;
  HelperCallOpnd *this_00;
  undefined4 *puVar9;
  RegOpnd *local_40;
  Lowerer *pLVar8;
  
  local_40 = strOpnd;
  if ((strOpnd->m_sym->field_0x19 & 4) == 0) {
    pFVar1 = this->m_func;
    if (reloadDst) {
      local_40 = IR::RegOpnd::New(TyVar,pFVar1);
    }
    target = IR::LabelInstr::New(Label,pFVar1,true);
    labelTarget = IR::LabelInstr::New(Label,pFVar1,false);
    bVar4 = IR::Opnd::IsNotTaggedValue(&strOpnd->super_Opnd);
    if (!bVar4) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&strOpnd->super_Opnd,insertBeforeInstr,labelTarget,false);
    }
    if ((loweringCloneStr) && (bVar4 = JITTimeWorkItem::IsLoopBody(pFVar1->m_workItem), bVar4)) {
      pLVar8 = (Lowerer *)0x0;
      pAVar7 = IR::AddrOpnd::New((Var)0x0,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
      InsertCompareBranch(pLVar8,&strOpnd->super_Opnd,&pAVar7->super_Opnd,BrEq_A,false,labelTarget,
                          insertBeforeInstr,false);
    }
    compareSrc1 = IR::IndirOpnd::New(strOpnd,0,TyUint64,pFVar1,false);
    pSVar2 = insertBeforeInstr->m_func->m_scriptContextInfo;
    iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x34);
    pLVar8 = (Lowerer *)CONCAT44(extraout_var,iVar6);
    pAVar7 = IR::AddrOpnd::New(pLVar8,AddrOpndKindDynamicVtable,this->m_func,false,(Var)0x0);
    InsertCompareBranch(pLVar8,&compareSrc1->super_Opnd,&pAVar7->super_Opnd,BrEq_A,false,target,
                        insertBeforeInstr,false);
    if (reloadDst) {
      InsertMove(&local_40->super_Opnd,&strOpnd->super_Opnd,insertBeforeInstr,true);
    }
    InsertBranch(Br,false,labelTarget,insertBeforeInstr);
    IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,insertBeforeInstr,&strOpnd->super_Opnd);
    instr = IR::Instr::New(Call,&local_40->super_Opnd,pFVar1);
    this_00 = IR::HelperCallOpnd::New(helperMethod,pFVar1);
    if (instr->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_0059c533;
      *puVar9 = 0;
    }
    pFVar1 = instr->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) {
LAB_0059c533:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    bVar5 = (this_00->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar5 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar5 | 2;
    instr->m_src1 = &this_00->super_Opnd;
    IR::Instr::InsertBefore(insertBeforeInstr,instr);
    LowererMD::LowerCall(&this->m_lowererMD,instr,0);
    IR::Instr::InsertBefore(insertBeforeInstr,&labelTarget->super_Instr);
  }
  return local_40;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateGetImmutableOrScriptUnreferencedString(IR::RegOpnd * strOpnd, IR::Instr * insertBeforeInstr, IR::JnHelperMethod helperMethod, bool loweringCloneStr, bool reloadDst)
{
    if (strOpnd->m_sym->m_isStrConst)
    {
        return strOpnd;
    }

    Func * const func = this->m_func;
    IR::RegOpnd  *dstOpnd = reloadDst == true ? IR::RegOpnd::New(TyVar, func) : strOpnd;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

    if (!strOpnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(strOpnd, insertBeforeInstr, doneLabel);
    }

    if (loweringCloneStr && func->IsLoopBody())
    {
        // Check if strOpnd is NULL before the CloneStr. There could be cases where SimpleJit might have dead stored instructions corresponding to the definition/use of strOpnd.
        // As a result during a bailout when we restore values from interpreter stack frame we may end up having strOpnd as nullptr. During FullJit we may not dead store the
        // instructions defining/using strOpnd due to StSlot instructions added at the end of jitted loop body. As a result, when we bailout (BailOnSimpleJitToFullJitLoopBody)
        // strOpnd could have a NULL value causing CloneStr to dereference a nullptr.
        this->InsertCompareBranch(strOpnd, IR::AddrOpnd::New(nullptr, IR::AddrOpndKindDynamicMisc, this->m_func), Js::OpCode::BrEq_A, false /*isUnsigned*/, doneLabel, insertBeforeInstr);
    }

    // CMP [strOpnd], Js::CompoundString::`vtable'
    // JEQ $helper
    InsertCompareBranch(
        IR::IndirOpnd::New(strOpnd, 0, TyMachPtr, func),
        this->LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableCompoundString),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertBeforeInstr);

    if (reloadDst)
    {
        InsertMove(dstOpnd, strOpnd, insertBeforeInstr);
    }

    InsertBranch(Js::OpCode::Br, doneLabel, insertBeforeInstr);
    insertBeforeInstr->InsertBefore(helperLabel);

    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, strOpnd);
    IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, dstOpnd, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));
    insertBeforeInstr->InsertBefore(callInstr);
    this->m_lowererMD.LowerCall(callInstr, 0);

    insertBeforeInstr->InsertBefore(doneLabel);

    return dstOpnd;
}